

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int *__ptr;
  int iVar3;
  Vec_Int_t *pVVar4;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x118,"Vec_Str_t *Acb_ObjCnfs(Acb_Ntk_t *, int)");
  }
  iVar1 = (p->vCnfs).nSize;
  if (iVar1 <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar4 = (p->vCnfs).pArray;
  if (pVVar4[(uint)iObj].nSize != 0) {
    __assert_fail("Vec_StrSize(vCnfBase) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x61,"void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *, int)");
  }
  if (iVar1 != (p->vObjType).nSize) {
    __assert_fail("Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x62,"void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *, int)");
  }
  uVar2 = (p->vObjTruth).nSize;
  if ((int)uVar2 < 1) {
    __assert_fail("Acb_NtkHasObjTruths(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
  }
  if (uVar2 <= (uint)iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                  ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = (p->vObjFans).pArray[(uint)iObj];
  if ((-1 < (long)iVar1) && (iVar1 < (p->vFanSto).nSize)) {
    pVVar4 = pVVar4 + (uint)iObj;
    Acb_DeriveCnfFromTruth
              ((p->vObjTruth).pArray[(uint)iObj],(p->vFanSto).pArray[iVar1],&p->vCover,&p->vCnf);
    iVar1 = (p->vCnf).nSize;
    __ptr = pVVar4->pArray;
    iVar3 = iVar1;
    if (pVVar4->nCap < iVar1) {
      if (__ptr == (int *)0x0) {
        __ptr = (int *)malloc((long)iVar1);
      }
      else {
        __ptr = (int *)realloc(__ptr,(long)iVar1);
        iVar3 = (p->vCnf).nSize;
      }
      pVVar4->pArray = __ptr;
      pVVar4->nCap = iVar1;
    }
    memcpy(__ptr,(p->vCnf).pArray,(long)iVar3);
    pVVar4->nSize = (p->vCnf).nSize;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Acb_DeriveCnfForWindowOne( Acb_Ntk_t * p, int iObj )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Str_t * vCnfBase = Acb_ObjCnfs( p, iObj );
    assert( Vec_StrSize(vCnfBase) == 0 ); // unassigned
    assert( Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p) );
    Acb_DeriveCnfFromTruth( Acb_ObjTruth(p, iObj), Acb_ObjFaninNum(p, iObj), &p->vCover, &p->vCnf );
    Vec_StrGrow( vCnfBase, Vec_StrSize(&p->vCnf) );
    memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(&p->vCnf), (size_t)Vec_StrSize(&p->vCnf) );
    vCnfBase->nSize = Vec_StrSize(&p->vCnf);
}